

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O3

string * __thiscall
google::protobuf::internal::GetTypeUrl_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,StringPiece message_name,
          StringPiece type_url_prefix)

{
  char cVar1;
  AlphaNum *c;
  AlphaNum local_c8;
  AlphaNum *local_98;
  char *local_90;
  AlphaNum local_68;
  undefined1 local_38 [8];
  StringPiece type_url_prefix_local;
  
  type_url_prefix_local.ptr_ = type_url_prefix.ptr_;
  local_38 = (undefined1  [8])message_name.length_;
  if (type_url_prefix_local.ptr_ == (char *)0x0) {
    local_90 = (char *)0x0;
    c = (AlphaNum *)0x0;
  }
  else {
    c = (AlphaNum *)(type_url_prefix_local.ptr_ + -1);
    cVar1 = StringPiece::operator[]((StringPiece *)local_38,(stringpiece_ssize_type)c);
    local_90 = type_url_prefix_local.ptr_;
    if (cVar1 == '/') {
      local_98 = (AlphaNum *)local_38;
      local_68.piece_data_ = (char *)this;
      local_68.piece_size_ = (size_t)message_name.ptr_;
      StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_98,&local_68,(AlphaNum *)local_38)
      ;
      return __return_storage_ptr__;
    }
  }
  local_68.piece_data_ = "/";
  local_68.piece_size_ = 1;
  local_c8.piece_data_ = (char *)this;
  local_c8.piece_size_ = (size_t)message_name.ptr_;
  local_98 = (AlphaNum *)local_38;
  StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_98,&local_68,&local_c8,c);
  return __return_storage_ptr__;
}

Assistant:

std::string GetTypeUrl(StringPiece message_name,
                       StringPiece type_url_prefix) {
  if (!type_url_prefix.empty() &&
      type_url_prefix[type_url_prefix.size() - 1] == '/') {
    return StrCat(type_url_prefix, message_name);
  } else {
    return StrCat(type_url_prefix, "/", message_name);
  }
}